

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

bool DeploymentEnabled<Consensus::BuriedDeployment>
               (ChainstateManager *chainman,BuriedDeployment dep)

{
  long lVar1;
  bool bVar2;
  undefined2 in_SI;
  long in_FS_OFFSET;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ChainstateManager::GetConsensus
            ((ChainstateManager *)
             CONCAT26(in_SI,CONCAT15(in_stack_ffffffffffffffed,in_stack_ffffffffffffffe8)));
  bVar2 = DeploymentEnabled((Params *)
                            CONCAT26(in_SI,CONCAT15(in_stack_ffffffffffffffed,
                                                    in_stack_ffffffffffffffe8)),0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DeploymentEnabled(const ChainstateManager& chainman, DEP dep)
{
    return DeploymentEnabled(chainman.GetConsensus(), dep);
}